

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  byte bVar1;
  byte bVar2;
  byte *c;
  ulong uVar3;
  byte *pbVar4;
  int lenght;
  byte *c_00;
  int lenght_00;
  byte *pbVar5;
  byte *c_01;
  string<char> s;
  SAttribute attr;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = (byte *)this->P;
  pbVar5 = c;
  while ((uVar3 = (ulong)*pbVar5, 0x3e < uVar3 || ((0x4000000100002600U >> (uVar3 & 0x3f) & 1) == 0)
         )) {
    pbVar5 = pbVar5 + 1;
    this->P = (char *)pbVar5;
  }
  c_01 = pbVar5;
  do {
    if ((byte)uVar3 < 0x3f) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x2f) {
          this->P = (char *)(c_01 + 1);
          this->IsEmptyElement = true;
LAB_005af834:
          if ((c < pbVar5) && (pbVar5[-1] == 0x2f)) {
            pbVar5 = pbVar5 + -1;
            this->IsEmptyElement = true;
          }
          core::string<char>::string<char>(&attr.Name,(char *)c,(int)pbVar5 - (int)c);
          core::string<char>::operator=(&this->NodeName,&attr.Name);
          core::string<char>::~string(&attr.Name);
          this->P = this->P + 1;
          return;
        }
        if (uVar3 == 0x3e) goto LAB_005af834;
        goto LAB_005af714;
      }
      c_01 = c_01 + 1;
      this->P = (char *)c_01;
    }
    else {
LAB_005af714:
      lenght = 0;
      c_00 = c_01;
      while ((c_00 = c_00 + 1, 0x3d < (byte)uVar3 ||
             ((0x2000000100002600U >> (uVar3 & 0x3f) & 1) == 0))) {
        this->P = (char *)c_00;
        lenght = lenght + 1;
        uVar3 = (ulong)*c_00;
      }
      do {
        this->P = (char *)c_00;
        bVar1 = *c_00;
        if (bVar1 == 0) {
          return;
        }
        c_00 = c_00 + 1;
      } while ((bVar1 != 0x27) && (bVar1 != 0x22));
      lenght_00 = -1;
      pbVar4 = c_00;
      do {
        this->P = (char *)pbVar4;
        bVar2 = *pbVar4;
        pbVar4 = pbVar4 + 1;
        lenght_00 = lenght_00 + 1;
        if (bVar2 == bVar1) break;
      } while (bVar2 != 0);
      if (bVar2 == 0) {
        return;
      }
      this->P = (char *)pbVar4;
      SAttribute::SAttribute(&attr);
      core::string<char>::string<char>(&s,(char *)c_01,lenght);
      core::string<char>::operator=(&attr.Name,&s);
      core::string<char>::~string(&s);
      core::string<char>::string<char>(&s,(char *)c_00,lenght_00);
      replaceSpecialCharacters
                ((CXMLReaderImpl<char,_irr::io::IXMLBase> *)&stack0xffffffffffffffc0,
                 (string<char> *)this);
      core::string<char>::operator=(&attr.Value,(string<char> *)&stack0xffffffffffffffc0);
      core::string<char>::~string((string<char> *)&stack0xffffffffffffffc0);
      core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::push_back
                (&this->Attributes,&attr);
      core::string<char>::~string(&s);
      SAttribute::~SAttribute(&attr);
      c_01 = (byte *)this->P;
    }
    uVar3 = (ulong)*c_01;
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}